

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

gdImagePtr gdImageCreateFromGif(FILE *fdFile)

{
  gdIOCtx *fd_00;
  gdImagePtr im;
  gdIOCtx *fd;
  FILE *fdFile_local;
  
  fd_00 = gdNewFileCtx(fdFile);
  if (fd_00 == (gdIOCtx *)0x0) {
    fdFile_local = (FILE *)0x0;
  }
  else {
    fdFile_local = (FILE *)gdImageCreateFromGifCtx(fd_00);
    (*fd_00->gd_free)(fd_00);
  }
  return (gdImagePtr)fdFile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGif(FILE *fdFile)
{
	gdIOCtx *fd = gdNewFileCtx(fdFile);
	gdImagePtr im;

	if (fd == NULL) return NULL;
	im = gdImageCreateFromGifCtx(fd);

	fd->gd_free(fd);

	return im;
}